

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBuildNameCommand.cxx
# Opt level: O3

bool __thiscall
cmBuildNameCommand::InitialPass
          (cmBuildNameCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  string *name;
  string *psVar1;
  cmMakefile *this_00;
  bool bVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  long *plVar6;
  undefined8 *puVar7;
  size_type sVar8;
  ulong *puVar9;
  ulong uVar10;
  _Alloc_hider _Var11;
  string buildname;
  string RegExp;
  string compiler;
  string local_1c0;
  ulong *local_1a0;
  long local_198;
  ulong local_190;
  undefined4 uStack_188;
  undefined4 uStack_184;
  string local_180;
  undefined1 *local_160;
  long local_158;
  undefined1 local_150;
  undefined7 uStack_14f;
  undefined1 *local_140;
  undefined8 local_138;
  undefined1 local_130;
  undefined7 uStack_12f;
  long *local_120;
  undefined8 local_118;
  long local_110;
  undefined8 uStack_108;
  undefined1 local_100 [80];
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_60;
  char *local_40;
  
  name = (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (name == psVar1) {
    local_100._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_100 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_100,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_100);
    _Var11._M_p = (pointer)local_100._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_100 + 0x10)) goto LAB_00181a11;
  }
  else {
    pcVar3 = cmMakefile::GetDefinition((this->super_cmCommand).Makefile,name);
    if (pcVar3 != (char *)0x0) {
      local_100._0_8_ = (char *)0x0;
      local_b0 = (char *)0x0;
      local_60 = (char *)0x0;
      local_40 = (char *)0x0;
      cmsys::RegularExpression::compile((RegularExpression *)local_100,"[()/]");
      bVar2 = cmsys::RegularExpression::find
                        ((RegularExpression *)local_100,pcVar3,(RegularExpressionMatch *)local_100);
      if (bVar2) {
        local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
        sVar4 = strlen(pcVar3);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,pcVar3,pcVar3 + sVar4);
        if (local_1c0._M_string_length != 0) {
          sVar8 = 0;
          do {
            if (local_1c0._M_dataplus._M_p[sVar8] == '/') {
              local_1c0._M_dataplus._M_p[sVar8] = '_';
            }
            sVar8 = sVar8 + 1;
          } while (local_1c0._M_string_length != sVar8);
          if (local_1c0._M_string_length != 0) {
            sVar8 = 0;
            do {
              if (local_1c0._M_dataplus._M_p[sVar8] == '(') {
                local_1c0._M_dataplus._M_p[sVar8] = '_';
              }
              sVar8 = sVar8 + 1;
            } while (local_1c0._M_string_length != sVar8);
            if (local_1c0._M_string_length != 0) {
              sVar8 = 0;
              do {
                if (local_1c0._M_dataplus._M_p[sVar8] == ')') {
                  local_1c0._M_dataplus._M_p[sVar8] = '_';
                }
                sVar8 = sVar8 + 1;
              } while (local_1c0._M_string_length != sVar8);
            }
          }
        }
        cmMakefile::AddCacheDefinition
                  ((this->super_cmCommand).Makefile,
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start,local_1c0._M_dataplus._M_p,
                   "Name of build.",STRING,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p,
                          (ulong)(local_1c0.field_2._M_allocated_capacity + 1));
        }
      }
      if (local_40 != (char *)0x0) {
        operator_delete__(local_40);
      }
      goto LAB_00181a11;
    }
    local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"WinNT","");
    this_00 = (this->super_cmCommand).Makefile;
    pcVar3 = local_100 + 0x10;
    local_100._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"UNIX","");
    pcVar5 = cmMakefile::GetDefinition(this_00,(string *)local_100);
    if ((char *)local_100._0_8_ != pcVar3) {
      operator_delete((void *)local_100._0_8_,(ulong)(local_100._16_8_ + 1));
    }
    if (pcVar5 != (char *)0x0) {
      local_1c0._M_string_length = 0;
      *local_1c0._M_dataplus._M_p = '\0';
      local_100._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"uname -a","");
      cmSystemTools::RunSingleCommand
                ((string *)local_100,&local_1c0,&local_1c0,(int *)0x0,(char *)0x0,OUTPUT_MERGE,
                 (cmDuration)0x0);
      if ((char *)local_100._0_8_ != pcVar3) {
        operator_delete((void *)local_100._0_8_,(ulong)(local_100._16_8_ + 1));
      }
      if (local_1c0._M_string_length != 0) {
        local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_180,"([^ ]*) [^ ]* ([^ ]*) ","");
        local_100._0_8_ = (char *)0x0;
        local_b0 = (char *)0x0;
        local_60 = (char *)0x0;
        local_40 = (char *)0x0;
        cmsys::RegularExpression::compile((RegularExpression *)local_100,local_180._M_dataplus._M_p)
        ;
        bVar2 = cmsys::RegularExpression::find
                          ((RegularExpression *)local_100,local_1c0._M_dataplus._M_p,
                           (RegularExpressionMatch *)local_100);
        if (bVar2) {
          local_140 = &local_130;
          if ((char *)local_100._8_8_ == (char *)0x0) {
            local_138 = 0;
            local_130 = 0;
          }
          else {
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_140,local_100._8_8_,local_a8);
          }
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_140);
          local_1a0 = &local_190;
          puVar9 = (ulong *)(plVar6 + 2);
          if ((ulong *)*plVar6 == puVar9) {
            local_190 = *puVar9;
            uStack_188 = (undefined4)plVar6[3];
            uStack_184 = *(undefined4 *)((long)plVar6 + 0x1c);
          }
          else {
            local_190 = *puVar9;
            local_1a0 = (ulong *)*plVar6;
          }
          local_198 = plVar6[1];
          *plVar6 = (long)puVar9;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          if ((char *)local_100._16_8_ == (char *)0x0) {
            local_160 = &local_150;
            local_158 = 0;
            local_150 = 0;
          }
          else {
            local_160 = &local_150;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_160,local_100._16_8_,local_a0);
          }
          uVar10 = 0xf;
          if (local_1a0 != &local_190) {
            uVar10 = local_190;
          }
          if (uVar10 < (ulong)(local_158 + local_198)) {
            uVar10 = 0xf;
            if (local_160 != &local_150) {
              uVar10 = CONCAT71(uStack_14f,local_150);
            }
            if (uVar10 < (ulong)(local_158 + local_198)) goto LAB_00181797;
            puVar7 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_160,0,(char *)0x0,(ulong)local_1a0)
            ;
          }
          else {
LAB_00181797:
            puVar7 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_1a0,(ulong)local_160);
          }
          local_120 = &local_110;
          plVar6 = puVar7 + 2;
          if ((long *)*puVar7 == plVar6) {
            local_110 = *plVar6;
            uStack_108 = puVar7[3];
          }
          else {
            local_110 = *plVar6;
            local_120 = (long *)*puVar7;
          }
          local_118 = puVar7[1];
          *puVar7 = plVar6;
          puVar7[1] = 0;
          *(undefined1 *)plVar6 = 0;
          std::__cxx11::string::operator=((string *)&local_1c0,(string *)&local_120);
          if (local_120 != &local_110) {
            operator_delete(local_120,local_110 + 1);
          }
          if (local_160 != &local_150) {
            operator_delete(local_160,CONCAT71(uStack_14f,local_150) + 1);
          }
          if (local_1a0 != &local_190) {
            operator_delete(local_1a0,local_190 + 1);
          }
          if (local_140 != &local_130) {
            operator_delete(local_140,CONCAT71(uStack_12f,local_130) + 1);
          }
        }
        if (local_40 != (char *)0x0) {
          operator_delete__(local_40);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != &local_180.field_2) {
          operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
        }
      }
    }
    local_100._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_100 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"${CMAKE_CXX_COMPILER}","");
    cmMakefile::ExpandVariablesInString((this->super_cmCommand).Makefile,(string *)local_100);
    std::__cxx11::string::append((char *)&local_1c0);
    cmsys::SystemTools::GetFilenameName(&local_180,(string *)local_100);
    std::__cxx11::string::_M_append((char *)&local_1c0,(ulong)local_180._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
    }
    if (local_1c0._M_string_length != 0) {
      sVar8 = 0;
      do {
        if (local_1c0._M_dataplus._M_p[sVar8] == '/') {
          local_1c0._M_dataplus._M_p[sVar8] = '_';
        }
        sVar8 = sVar8 + 1;
      } while (local_1c0._M_string_length != sVar8);
      if (local_1c0._M_string_length != 0) {
        sVar8 = 0;
        do {
          if (local_1c0._M_dataplus._M_p[sVar8] == '(') {
            local_1c0._M_dataplus._M_p[sVar8] = '_';
          }
          sVar8 = sVar8 + 1;
        } while (local_1c0._M_string_length != sVar8);
        if (local_1c0._M_string_length != 0) {
          sVar8 = 0;
          do {
            if (local_1c0._M_dataplus._M_p[sVar8] == ')') {
              local_1c0._M_dataplus._M_p[sVar8] = '_';
            }
            sVar8 = sVar8 + 1;
          } while (local_1c0._M_string_length != sVar8);
        }
      }
    }
    cmMakefile::AddCacheDefinition
              ((this->super_cmCommand).Makefile,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,local_1c0._M_dataplus._M_p,
               "Name of build.",STRING,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_100 + 0x10)) {
      operator_delete((void *)local_100._0_8_,(ulong)(local_100._16_8_ + 1));
    }
    local_100._16_8_ = local_1c0.field_2._M_allocated_capacity;
    _Var11._M_p = local_1c0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p == &local_1c0.field_2) goto LAB_00181a11;
  }
  operator_delete(_Var11._M_p,(ulong)(local_100._16_8_ + 1));
LAB_00181a11:
  return name != psVar1;
}

Assistant:

bool cmBuildNameCommand::InitialPass(std::vector<std::string> const& args,
                                     cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  const char* cacheValue = this->Makefile->GetDefinition(args[0]);
  if (cacheValue) {
    // do we need to correct the value?
    cmsys::RegularExpression reg("[()/]");
    if (reg.find(cacheValue)) {
      std::string cv = cacheValue;
      std::replace(cv.begin(), cv.end(), '/', '_');
      std::replace(cv.begin(), cv.end(), '(', '_');
      std::replace(cv.begin(), cv.end(), ')', '_');
      this->Makefile->AddCacheDefinition(args[0], cv.c_str(), "Name of build.",
                                         cmStateEnums::STRING);
    }
    return true;
  }

  std::string buildname = "WinNT";
  if (this->Makefile->GetDefinition("UNIX")) {
    buildname.clear();
    cmSystemTools::RunSingleCommand("uname -a", &buildname, &buildname);
    if (!buildname.empty()) {
      std::string RegExp = "([^ ]*) [^ ]* ([^ ]*) ";
      cmsys::RegularExpression reg(RegExp);
      if (reg.find(buildname)) {
        buildname = reg.match(1) + "-" + reg.match(2);
      }
    }
  }
  std::string compiler = "${CMAKE_CXX_COMPILER}";
  this->Makefile->ExpandVariablesInString(compiler);
  buildname += "-";
  buildname += cmSystemTools::GetFilenameName(compiler);
  std::replace(buildname.begin(), buildname.end(), '/', '_');
  std::replace(buildname.begin(), buildname.end(), '(', '_');
  std::replace(buildname.begin(), buildname.end(), ')', '_');

  this->Makefile->AddCacheDefinition(args[0], buildname.c_str(),
                                     "Name of build.", cmStateEnums::STRING);
  return true;
}